

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::TextFile(TextFile *this)

{
  TextFile *this_local;
  
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream(&this->stream);
  ghc::filesystem::path::path(&this->fileName);
  std::__cxx11::string::string((string *)&this->errorText);
  std::__cxx11::string::string((string *)&this->content);
  std::__cxx11::string::string((string *)&this->buf);
  this->recursion = false;
  this->errorRetrieved = false;
  this->fromMemory = false;
  this->bufPos = 0;
  this->lineCount = 0;
  return;
}

Assistant:

TextFile::TextFile()
{
	recursion = false;
	errorRetrieved = false;
	fromMemory = false;
	bufPos = 0;
	lineCount = 0;
}